

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditPrivate::completionHighlighted(QLineEditPrivate *this,QString *newText)

{
  long lVar1;
  CompletionMode CVar2;
  int pos;
  QStringView *a;
  qsizetype in_RSI;
  QLineEditPrivate *in_RDI;
  long in_FS_OFFSET;
  bool mark;
  int c;
  QLineEdit *q;
  QString text;
  QStringBuilder<QStringView,_QStringView> *in_stack_ffffffffffffff28;
  QLineEdit *in_stack_ffffffffffffff30;
  QString *in_stack_ffffffffffffff38;
  undefined1 mark_00;
  undefined4 in_stack_ffffffffffffff48;
  QStringView *n;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  a = (QStringView *)q_func(in_RDI);
  QWidgetLineControl::completer((QWidgetLineControl *)0x5d121e);
  CVar2 = QCompleter::completionMode((QCompleter *)in_stack_ffffffffffffff30);
  if (CVar2 == InlineCompletion) {
    pos = QWidgetLineControl::cursor((QWidgetLineControl *)in_RDI->control);
    QWidgetLineControl::text((QWidgetLineControl *)in_RDI);
    n = a;
    QStringView::QStringView<QString,_true>((QStringView *)in_RDI,in_stack_ffffffffffffff38);
    QStringView::left((QStringView *)CONCAT44(pos,in_stack_ffffffffffffff48),(qsizetype)in_RDI);
    QStringView::QStringView<QString,_true>((QStringView *)in_RDI,in_stack_ffffffffffffff38);
    QStringView::mid((QStringView *)CONCAT44(pos,in_stack_ffffffffffffff48),in_RSI,(qsizetype)n);
    ::operator+(a,&in_stack_ffffffffffffff28->a);
    ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff28);
    QLineEdit::setText((QLineEdit *)a,(QString *)in_stack_ffffffffffffff28);
    QString::~QString((QString *)0x5d134b);
    mark_00 = (undefined1)((ulong)in_RDI->control >> 0x38);
    QWidgetLineControl::end((QWidgetLineControl *)0x5d1368);
    QWidgetLineControl::moveCursor((QWidgetLineControl *)in_RDI,pos,(bool)mark_00);
    QWidgetLineControl::moveCursor((QWidgetLineControl *)in_RDI,pos,(bool)mark_00);
    QString::~QString((QString *)0x5d13a2);
  }
  else {
    QLineEdit::setText(in_stack_ffffffffffffff30,(QString *)in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::completionHighlighted(const QString &newText)
{
    Q_Q(QLineEdit);
    if (control->completer()->completionMode() != QCompleter::InlineCompletion) {
        q->setText(newText);
    } else {
        int c = control->cursor();
        QString text = control->text();
        q->setText(QStringView{text}.left(c) + QStringView{newText}.mid(c));
        control->moveCursor(control->end(), false);
#ifndef Q_OS_ANDROID
        const bool mark = true;
#else
        const bool mark = (imHints & Qt::ImhNoPredictiveText);
#endif
        control->moveCursor(c, mark);
    }
}